

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Msk.cpp
# Opt level: O2

int processMsk4(istream *in,path *output)

{
  pointer data;
  bool bVar1;
  runtime_error *prVar2;
  Size size;
  uint __val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> decompressedData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressedData;
  string local_138;
  Msk4Header header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  operator>>(in,&header);
  compressedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  decompressedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  compressedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  compressedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  decompressedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  decompressedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&compressedData,(ulong)(header.dataSize - 4));
  std::istream::seekg((long)in,header.dataOffset + 4);
  std::istream::read((char *)in,
                     (long)compressedData.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  bVar1 = decompressHigu(&decompressedData,
                         compressedData.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (int)compressedData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                         (int)compressedData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,true);
  data = decompressedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Decompression failed");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __val = (uint)header.height * (uint)header.width;
  if ((long)decompressedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)decompressedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == (ulong)__val) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"",(allocator<char> *)&local_108);
    size.height._0_2_ = header.height;
    size.width = (uint)header.width;
    size.height._2_2_ = 0;
    writePNG(output,GRAY,size,data,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&decompressedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&compressedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return 0;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_a8,__val);
  std::operator+(&local_88,"Expected ",&local_a8);
  std::operator+(&local_68,&local_88," bytes but got ");
  std::__cxx11::to_string
            (&local_c8,
             (long)decompressedData.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)decompressedData.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  std::operator+(&local_48,&local_68,&local_c8);
  std::operator+(&local_108,&local_48," bytes when processing ");
  std::filesystem::__cxx11::path::string(&local_e8,&currentFileName_abi_cxx11_);
  std::operator+(&local_138,&local_108,&local_e8);
  std::runtime_error::runtime_error(prVar2,(string *)&local_138);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int processMsk4(std::istream &in, const fs::path &output) {
	Msk4Header header;
	in >> header;
	Size size { header.width, header.height };

	std::vector<uint8_t> compressedData, decompressedData;
	// First thing in data is its size (uint32)
	compressedData.resize(header.dataSize - 4);
	in.seekg(header.dataOffset + 4, in.beg);
	in.read((char *)compressedData.data(), compressedData.size());

	// TODO: Figure out what the stuff between the header and data is

	if (!decompressHigu(decompressedData, compressedData.data(), (int)compressedData.size(), true)) {
		throw std::runtime_error("Decompression failed");
	}

	if (decompressedData.size() != size.area()) {
		throw std::runtime_error("Expected " + std::to_string(size.area()) + " bytes but got " + std::to_string(decompressedData.size()) + " bytes when processing " + currentFileName.string());
	}

	writePNG(output, PNGColorType::GRAY, size, decompressedData.data());

	return 0;
}